

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t tree_ascend(tree *t)

{
  long lVar1;
  int *piVar2;
  long *in_RDI;
  wchar_t prev_dir_fd;
  wchar_t r;
  wchar_t new_fd;
  tree_entry *te;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  wchar_t local_18;
  wchar_t local_14;
  
  local_18 = L'\0';
  lVar1 = *in_RDI;
  if ((*(uint *)(lVar1 + 0x48) & 2) == 0) {
    local_14 = open_on_current_dir((tree *)CONCAT44((int)in_RDI[0xf],in_stack_ffffffffffffffe0),
                                   in_stack_ffffffffffffffd8,L'\0');
    __archive_ensure_cloexec_flag(0);
  }
  else {
    local_14 = *(wchar_t *)(lVar1 + 0x50);
  }
  if (local_14 < L'\0') {
    piVar2 = __errno_location();
    *(int *)(in_RDI + 7) = *piVar2;
    local_18 = L'\xfffffffe';
  }
  else {
    *(wchar_t *)(in_RDI + 0xf) = local_14;
    *(uint *)(in_RDI + 6) = *(uint *)(in_RDI + 6) & 0xffffffbf;
    close_and_restore_time((wchar_t)t,(tree *)te,_r);
    if ((*(uint *)(lVar1 + 0x48) & 2) != 0) {
      *(int *)((long)in_RDI + 0x6c) = *(int *)((long)in_RDI + 0x6c) + -1;
      *(undefined4 *)(lVar1 + 0x50) = 0xffffffff;
    }
    *(int *)(in_RDI + 0xd) = (int)in_RDI[0xd] + -1;
  }
  return local_18;
}

Assistant:

static int
tree_ascend(struct tree *t)
{
	struct tree_entry *te;
	int new_fd, r = 0, prev_dir_fd;

	te = t->stack;
	prev_dir_fd = t->working_dir_fd;
	if (te->flags & isDirLink)
		new_fd = te->symlink_parent_fd;
	else {
		new_fd = open_on_current_dir(t, "..", O_RDONLY | O_CLOEXEC);
		__archive_ensure_cloexec_flag(new_fd);
	}
	if (new_fd < 0) {
		t->tree_errno = errno;
		r = TREE_ERROR_FATAL;
	} else {
		/* Renew the current working directory. */
		t->working_dir_fd = new_fd;
		t->flags &= ~onWorkingDir;
		/* Current directory has been changed, we should
		 * close an fd of previous working directory. */
		close_and_restore_time(prev_dir_fd, t, &te->restore_time);
		if (te->flags & isDirLink) {
			t->openCount--;
			te->symlink_parent_fd = -1;
		}
		t->depth--;
	}
	return (r);
}